

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::TextFormat::FastFieldValuePrinter::PrintString
          (FastFieldValuePrinter *this,string *val,BaseTextGenerator *generator)

{
  BaseTextGenerator *this_00;
  ulong uVar1;
  undefined1 auVar2 [16];
  string local_50 [32];
  string_view local_30;
  BaseTextGenerator *local_20;
  BaseTextGenerator *generator_local;
  string *val_local;
  FastFieldValuePrinter *this_local;
  
  local_20 = generator;
  generator_local = (BaseTextGenerator *)val;
  val_local = (string *)this;
  BaseTextGenerator::PrintLiteral<2ul>(generator,(char (*) [2])0x6584e2);
  uVar1 = std::__cxx11::string::empty();
  this_00 = local_20;
  if ((uVar1 & 1) == 0) {
    auVar2 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)generator_local);
    absl::lts_20240722::CEscape_abi_cxx11_(local_50,auVar2._0_8_,auVar2._8_8_);
    local_30 = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view(local_50);
    BaseTextGenerator::PrintString(this_00,local_30);
    std::__cxx11::string::~string(local_50);
  }
  BaseTextGenerator::PrintLiteral<2ul>(local_20,(char (*) [2])0x6584e2);
  return;
}

Assistant:

void TextFormat::FastFieldValuePrinter::PrintString(
    const std::string& val, BaseTextGenerator* generator) const {
  generator->PrintLiteral("\"");
  if (!val.empty()) {
    generator->PrintString(absl::CEscape(val));
  }
  generator->PrintLiteral("\"");
}